

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::GridRenderCase::
genTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream local_190 [8];
  ostringstream buf;
  GridRenderCase_conflict *this_local;
  
  buf._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,
                           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\n\nin highp vec4 tess_ctrl_color[];\nout highp vec4 tess_color;\nuniform highp vec4 u_posScale;\npatch in highp float vp_bbox_expansionSize;\npatch in highp vec3 vp_bbox_clipMin;\npatch in highp vec3 vp_bbox_clipMax;\nflat out highp float v_"
                          );
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_expansionSize;\nflat out highp vec3 v_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin;\nflat out highp vec3 v_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMax;\n\nprecise gl_Position;\n\n");
  pcVar2 = anon_unknown_1::BBoxRenderCase::genShaderFunction
                     ((BBoxRenderCase *)this,SHADER_FUNC_MIRROR_Y);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           "void main()\n{\n\t// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n\tgl_Position = mirrorY(gl_TessCoord.x * gl_in[0].gl_Position.zwyx +\n\t                      gl_TessCoord.y * gl_in[1].gl_Position.zwyx +\n\t                      gl_TessCoord.z * gl_in[2].gl_Position.zwyx);\n\ttess_color = tess_ctrl_color[0];\n\tv_"
                          );
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_expansionSize = vp_bbox_expansionSize;\n\tv_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin = vp_bbox_clipMin;\n\tv_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"bbox_clipMax = vp_bbox_clipMax;\n}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string GridRenderCase::genTessellationEvaluationSource (void) const
{
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			"${GPU_SHADER5_REQUIRE}\n"
			"layout(triangles) in;\n"
			"\n"
			"in highp vec4 tess_ctrl_color[];\n"
			"out highp vec4 tess_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"patch in highp float vp_bbox_expansionSize;\n"
			"patch in highp vec3 vp_bbox_clipMin;\n"
			"patch in highp vec3 vp_bbox_clipMax;\n"
			"flat out highp float v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize;\n"
			"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
			"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
			"\n"
			"precise gl_Position;\n"
			"\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_Y)
		<<	"void main()\n"
			"{\n"
			"	// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n"
			"	gl_Position = mirrorY(gl_TessCoord.x * gl_in[0].gl_Position.zwyx +\n"
			"	                      gl_TessCoord.y * gl_in[1].gl_Position.zwyx +\n"
			"	                      gl_TessCoord.z * gl_in[2].gl_Position.zwyx);\n"
			"	tess_color = tess_ctrl_color[0];\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize = vp_bbox_expansionSize;\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin = vp_bbox_clipMin;\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax = vp_bbox_clipMax;\n"
			"}\n";

	return buf.str();
}